

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ResourceDirWrapper.cpp
# Opt level: O0

bool __thiscall ResourceDirWrapper::wrap(ResourceDirWrapper *this)

{
  WORD WVar1;
  int iVar2;
  ResourceEntryWrapper *this_00;
  undefined4 extraout_var;
  ResourceEntryWrapper *local_80;
  ResourceEntryWrapper *local_68;
  resource_type local_60;
  resource_type typeId;
  ResourceEntryWrapper *local_50;
  ResourceEntryWrapper *entry;
  long topDirId;
  size_t i;
  size_t totalEntries;
  size_t idsNum;
  size_t namesNum;
  IMAGE_RESOURCE_DIRECTORY *dir;
  ResourceDirWrapper *this_local;
  
  dir = (IMAGE_RESOURCE_DIRECTORY *)this;
  (*(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.
    super_ExeElementWrapper.super_AbstractByteBuffer._vptr_AbstractByteBuffer[0x2c])();
  if ((this->topEntryID == -1) && (this->album != (ResourcesAlbum *)0x0)) {
    ResourcesAlbum::clear(this->album);
  }
  namesNum = (size_t)resourceDir(this);
  if ((IMAGE_RESOURCE_DIRECTORY *)namesNum == (IMAGE_RESOURCE_DIRECTORY *)0x0) {
    this_local._7_1_ = false;
  }
  else {
    idsNum = (size_t)((IMAGE_RESOURCE_DIRECTORY *)namesNum)->NumberOfNamedEntries;
    totalEntries = (size_t)((IMAGE_RESOURCE_DIRECTORY *)namesNum)->NumberOfIdEntries;
    i = idsNum + totalEntries;
    for (topDirId = 0; (ulong)topDirId < i && (ulong)topDirId < 0x32; topDirId = topDirId + 1) {
      if (this->topEntryID == -1) {
        local_80 = (ResourceEntryWrapper *)topDirId;
      }
      else {
        local_80 = (ResourceEntryWrapper *)this->topEntryID;
      }
      entry = local_80;
      this_00 = (ResourceEntryWrapper *)operator_new(0x70);
      ResourceEntryWrapper::ResourceEntryWrapper
                (this_00,(this->super_DataDirEntryWrapper).super_PENodeWrapper.m_PE,this,topDirId,
                 (long)entry,this->album);
      local_50 = this_00;
      iVar2 = (*(this_00->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
                super_AbstractByteBuffer._vptr_AbstractByteBuffer[0xc])();
      if (CONCAT44(extraout_var,iVar2) == 0) {
        if (local_50 != (ResourceEntryWrapper *)0x0) {
          (*(local_50->super_PENodeWrapper).super_ExeNodeWrapper.super_ExeElementWrapper.
            super_AbstractByteBuffer._vptr_AbstractByteBuffer[1])();
        }
        break;
      }
      if ((this->topEntryID == -1) && (this->album != (ResourcesAlbum *)0x0)) {
        WVar1 = ResourceEntryWrapper::getID(local_50);
        local_60 = (resource_type)WVar1;
        ResourcesAlbum::mapIdToLeafType(this->album,topDirId,local_60);
      }
      local_68 = local_50;
      std::vector<ExeNodeWrapper_*,_std::allocator<ExeNodeWrapper_*>_>::push_back
                (&(this->super_DataDirEntryWrapper).super_PENodeWrapper.super_ExeNodeWrapper.entries
                 ,(value_type *)&local_68);
    }
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool ResourceDirWrapper::wrap()
{
    clear();
    if (this->topEntryID == TOP_ENTRY_ROOT && this->album != NULL) {
        this->album->clear();
    }
    IMAGE_RESOURCE_DIRECTORY* dir = resourceDir();
    if (dir == NULL) return false;
    size_t namesNum = dir->NumberOfNamedEntries;
    size_t idsNum = dir->NumberOfIdEntries;

    size_t totalEntries = namesNum + idsNum;
    for (size_t i = 0; i < totalEntries && i < MAX_ENTRIES; i++ ) {

        long topDirId = (this->topEntryID != TOP_ENTRY_ROOT) ? this->topEntryID : long(i) ;

        //ResourceEntryWrapper(PEFile *pe, ResourceDirWrapper *parentDir, size_t entryNumber, long topEntryId, ResourcesAlbum *resAlbum)
        ResourceEntryWrapper* entry = new ResourceEntryWrapper(this->m_PE, this, i, topDirId, this->album);

        if (entry->getPtr() == NULL) {
            delete entry;
            break;
        }
        if (this->topEntryID == TOP_ENTRY_ROOT && this->album != NULL) {
            pe::resource_type typeId = static_cast<pe::resource_type>(entry->getID());
            this->album->mapIdToLeafType(i, typeId);
        }
        //this->parsedSize += val;
        this->entries.push_back(entry);
    }
    //printf("Entries: %d\n", getEntriesCount());
    return true;
}